

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void desc_ego_fake(wchar_t oid)

{
  wchar_t wVar1;
  ego_item *peVar2;
  textblock *tb;
  char *header;
  
  peVar2 = e_info;
  wVar1 = default_join[oid].oid;
  tb = object_info_ego(e_info + wVar1);
  header = format("%s %s",object_text_order[default_join[oid].gid].name,peVar2[wVar1].name);
  textui_textblock_show(tb,(region)ZEXT816(0),header);
  textblock_free(tb);
  return;
}

Assistant:

static void desc_ego_fake(int oid)
{
	int e_idx = default_item_id(oid);
	struct ego_item *ego = &e_info[e_idx];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	/* List ego flags */
	tb = object_info_ego(ego);

	textui_textblock_show(tb, area, format("%s %s",
										   ego_grp_name(default_group_id(oid)),
										   ego->name));
	textblock_free(tb);
}